

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

string * __thiscall
flatbuffers::ts::TsGenerator::GenTypeName
          (string *__return_storage_ptr__,TsGenerator *this,import_set *imports,Definition *owner,
          Type *type,bool input,bool allowNull)

{
  BaseType BVar1;
  bool bVar2;
  char *pcVar3;
  allocator<char> local_2b2;
  allocator<char> local_2b1;
  ImportDefinition local_2b0;
  undefined1 local_1e0 [8];
  string enum_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string name_1;
  ImportDefinition local_138;
  undefined1 local_58 [8];
  string name;
  bool allowNull_local;
  bool input_local;
  Type *type_local;
  Definition *owner_local;
  import_set *imports_local;
  TsGenerator *this_local;
  
  name.field_2._M_local_buf[0xe] = allowNull;
  name.field_2._M_local_buf[0xf] = input;
  if ((input) || ((bVar2 = IsString(type), !bVar2 && (type->base_type != BASE_TYPE_STRUCT)))) {
    BVar1 = type->base_type;
    if (BVar1 == BASE_TYPE_BOOL) {
      pcVar3 = "boolean";
      if ((name.field_2._M_local_buf[0xe] & 1U) != 0) {
        pcVar3 = "boolean|null";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar3,
                 (allocator<char> *)(name_1.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(name_1.field_2._M_local_buf + 0xf));
    }
    else if (BVar1 - BASE_TYPE_LONG < 2) {
      pcVar3 = "bigint";
      if ((name.field_2._M_local_buf[0xe] & 1U) != 0) {
        pcVar3 = "bigint|null";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar3,
                 (allocator<char> *)(name_1.field_2._M_local_buf + 0xe));
      std::allocator<char>::~allocator((allocator<char> *)(name_1.field_2._M_local_buf + 0xe));
    }
    else if (BVar1 == BASE_TYPE_ARRAY) {
      std::__cxx11::string::string((string *)local_160);
      if ((type->element == BASE_TYPE_LONG) || (type->element == BASE_TYPE_ULONG)) {
        std::__cxx11::string::operator=((string *)local_160,"bigint[]");
      }
      else if (type->element == BASE_TYPE_STRUCT) {
        std::__cxx11::string::operator=((string *)local_160,"any[]");
        if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) {
          GetTypeName_abi_cxx11_
                    ((string *)((long)&enum_name.field_2 + 8),this,type->struct_def,true,false);
          std::operator+(&local_1a0,"(any|",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&enum_name.field_2 + 8));
          std::operator+(&local_180,&local_1a0,")[]");
          std::__cxx11::string::operator=((string *)local_160,(string *)&local_180);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)(enum_name.field_2._M_local_buf + 8));
        }
      }
      else {
        std::__cxx11::string::operator=((string *)local_160,"number[]");
      }
      pcVar3 = "";
      if ((name.field_2._M_local_buf[0xe] & 1U) != 0) {
        pcVar3 = "|null";
      }
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                     pcVar3);
      std::__cxx11::string::~string((string *)local_160);
    }
    else {
      bVar2 = IsScalar(type->base_type);
      if (bVar2) {
        if (type->enum_def == (EnumDef *)0x0) {
          pcVar3 = "number";
          if ((name.field_2._M_local_buf[0xe] & 1U) != 0) {
            pcVar3 = "number|null";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,pcVar3,&local_2b1);
          std::allocator<char>::~allocator(&local_2b1);
        }
        else {
          AddImport<flatbuffers::EnumDef>(&local_2b0,this,imports,owner,type->enum_def);
          std::__cxx11::string::string((string *)local_1e0,(string *)&local_2b0);
          anon_unknown_10::ImportDefinition::~ImportDefinition(&local_2b0);
          if ((name.field_2._M_local_buf[0xe] & 1U) == 0) {
            std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_1e0);
          }
          else {
            std::operator+(__return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e0,"|null");
          }
          std::__cxx11::string::~string((string *)local_1e0);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"flatbuffers.Offset",&local_2b2);
        std::allocator<char>::~allocator(&local_2b2);
      }
    }
  }
  else {
    std::__cxx11::string::string((string *)local_58);
    bVar2 = IsString(type);
    if (bVar2) {
      std::__cxx11::string::operator=((string *)local_58,"string|Uint8Array");
    }
    else {
      AddImport<flatbuffers::StructDef>(&local_138,this,imports,owner,type->struct_def);
      std::__cxx11::string::operator=((string *)local_58,(string *)&local_138);
      anon_unknown_10::ImportDefinition::~ImportDefinition(&local_138);
    }
    if ((name.field_2._M_local_buf[0xe] & 1U) == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_58);
    }
    else {
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "|null");
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeName(import_set &imports, const Definition &owner,
                          const Type &type, bool input,
                          bool allowNull = false) {
    if (!input) {
      if (IsString(type) || type.base_type == BASE_TYPE_STRUCT) {
        std::string name;
        if (IsString(type)) {
          name = "string|Uint8Array";
        } else {
          name = AddImport(imports, owner, *type.struct_def).name;
        }
        return allowNull ? (name + "|null") : name;
      }
    }

    switch (type.base_type) {
      case BASE_TYPE_BOOL: return allowNull ? "boolean|null" : "boolean";
      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG: return allowNull ? "bigint|null" : "bigint";
      case BASE_TYPE_ARRAY: {
        std::string name;
        if (type.element == BASE_TYPE_LONG || type.element == BASE_TYPE_ULONG) {
          name = "bigint[]";
        } else if (type.element != BASE_TYPE_STRUCT) {
          name = "number[]";
        } else {
          name = "any[]";
          if (parser_.opts.generate_object_based_api) {
            name = "(any|" +
                   GetTypeName(*type.struct_def, /*object_api =*/true) + ")[]";
          }
        }

        return name + (allowNull ? "|null" : "");
      }
      default:
        if (IsScalar(type.base_type)) {
          if (type.enum_def) {
            const auto enum_name =
                AddImport(imports, owner, *type.enum_def).name;
            return allowNull ? (enum_name + "|null") : enum_name;
          }
          return allowNull ? "number|null" : "number";
        }
        return "flatbuffers.Offset";
    }
  }